

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring_array.c
# Opt level: O1

_Bool ra_overwrite(roaring_array_t *source,roaring_array_t *dest,_Bool copy_on_write)

{
  int32_t new_capacity;
  void *pvVar1;
  bool bVar2;
  _Bool _Var3;
  int iVar4;
  container_t *pcVar5;
  long lVar6;
  long lVar7;
  
  ra_clear_containers(dest);
  new_capacity = source->size;
  if (new_capacity == 0) {
    dest->size = 0;
  }
  else {
    if ((dest->allocation_size < new_capacity) && (_Var3 = realloc_array(dest,new_capacity), !_Var3)
       ) {
      return false;
    }
    iVar4 = source->size;
    dest->size = iVar4;
    memcpy(dest->keys,source->keys,(long)iVar4 * 2);
    if (copy_on_write) {
      iVar4 = dest->size;
      if (0 < iVar4) {
        lVar7 = 0;
        do {
          pcVar5 = get_copy_of_container(source->containers[lVar7],source->typecodes + lVar7,true);
          source->containers[lVar7] = pcVar5;
          lVar7 = lVar7 + 1;
          iVar4 = dest->size;
        } while (lVar7 < iVar4);
      }
      memcpy(dest->containers,source->containers,(long)iVar4 << 3);
      memcpy(dest->typecodes,source->typecodes,(long)dest->size);
    }
    else {
      memcpy(dest->typecodes,source->typecodes,(long)dest->size);
      bVar2 = 0 < dest->size;
      if (0 < dest->size) {
        pcVar5 = container_clone(*source->containers,*source->typecodes);
        *dest->containers = pcVar5;
        pvVar1 = *dest->containers;
        if (pvVar1 == (void *)0x0) {
          lVar7 = 0;
        }
        else {
          lVar6 = 1;
          do {
            lVar7 = lVar6;
            bVar2 = lVar7 < dest->size;
            if (dest->size <= lVar7) {
              return true;
            }
            pcVar5 = container_clone(source->containers[lVar7],source->typecodes[lVar7]);
            dest->containers[lVar7] = pcVar5;
            lVar6 = lVar7 + 1;
          } while (dest->containers[lVar7] != (void *)0x0);
        }
        if (pvVar1 != (void *)0x0) {
          lVar6 = 0;
          do {
            container_free(dest->containers[lVar6],dest->typecodes[lVar6]);
            lVar6 = lVar6 + 1;
          } while (lVar7 != lVar6);
        }
        roaring_free(dest->containers);
        dest->keys = (uint16_t *)0x0;
        dest->typecodes = (uint8_t *)0x0;
        dest->size = 0;
        dest->allocation_size = 0;
        dest->containers = (void **)0x0;
        if (bVar2) {
          return false;
        }
      }
    }
  }
  return true;
}

Assistant:

bool ra_overwrite(const roaring_array_t *source, roaring_array_t *dest,
                  bool copy_on_write) {
    ra_clear_containers(dest);  // we are going to overwrite them
    if (source->size == 0) {    // Note: can't call memcpy(NULL), even w/size
        dest->size = 0;         // <--- This is important.
        return true;            // output was just cleared, so they match
    }
    if (dest->allocation_size < source->size) {
        if (!realloc_array(dest, source->size)) {
            return false;
        }
    }
    dest->size = source->size;
    memcpy(dest->keys, source->keys, dest->size * sizeof(uint16_t));
    // we go through the containers, turning them into shared containers...
    if (copy_on_write) {
        for (int32_t i = 0; i < dest->size; ++i) {
            source->containers[i] = get_copy_of_container(
                source->containers[i], &source->typecodes[i], copy_on_write);
        }
        // we do a shallow copy to the other bitmap
        memcpy(dest->containers, source->containers,
               dest->size * sizeof(container_t *));
        memcpy(dest->typecodes, source->typecodes,
               dest->size * sizeof(uint8_t));
    } else {
        memcpy(dest->typecodes, source->typecodes,
               dest->size * sizeof(uint8_t));
        for (int32_t i = 0; i < dest->size; i++) {
            dest->containers[i] =
                container_clone(source->containers[i], source->typecodes[i]);
            if (dest->containers[i] == NULL) {
                for (int32_t j = 0; j < i; j++) {
                    container_free(dest->containers[j], dest->typecodes[j]);
                }
                ra_clear_without_containers(dest);
                return false;
            }
        }
    }
    return true;
}